

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

Env * evaluator::Evaluator::extendFunctionEnv
                (GCPtr<symbols::FunctionObject> *function,
                vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  int iVar1;
  Env *this;
  FunctionObject *pFVar2;
  size_type sVar3;
  reference ppIVar4;
  reference this_00;
  Object *obj;
  string local_48;
  int local_24;
  Env *pEStack_20;
  int paramIndex;
  Env *env;
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args_local;
  GCPtr<symbols::FunctionObject> *function_local;
  
  env = (Env *)args;
  args_local = (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)function;
  pFVar2 = GCPtr<symbols::FunctionObject>::operator->(function);
  pEStack_20 = NewEnvironment(pFVar2->env);
  local_24 = 0;
  while( true ) {
    iVar1 = local_24;
    pFVar2 = GCPtr<symbols::FunctionObject>::operator->
                       ((GCPtr<symbols::FunctionObject> *)args_local);
    sVar3 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::size
                      (&pFVar2->parameters);
    this = pEStack_20;
    if ((int)sVar3 <= iVar1) break;
    pFVar2 = GCPtr<symbols::FunctionObject>::operator->
                       ((GCPtr<symbols::FunctionObject> *)args_local);
    ppIVar4 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::operator[]
                        (&pFVar2->parameters,(long)local_24);
    std::__cxx11::string::string((string *)&local_48,&((*ppIVar4)->tok).Literal);
    this_00 = std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
              operator[]((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *
                         )env,(long)local_24);
    obj = GCPtr<symbols::Object>::unref(this_00);
    symbols::Env::put(this,&local_48,obj);
    std::__cxx11::string::~string((string *)&local_48);
    local_24 = local_24 + 1;
  }
  return pEStack_20;
}

Assistant:

Env* Evaluator::extendFunctionEnv(GCPtr<FunctionObject>& function, std::vector<GCPtr<Object>>& args){
    auto env = NewEnvironment(function->env);
    for(int paramIndex{0}; paramIndex < (int)function->parameters.size(); paramIndex++){
        env->put(function->parameters[paramIndex]->tok.Literal, args[paramIndex].unref());
    }
    return env;
}